

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::~Statistics(Statistics *this)

{
  undefined8 *in_RDI;
  
  (*(code *)**(undefined8 **)*in_RDI)();
  (*(code *)**(undefined8 **)in_RDI[1])();
  (*(code *)**(undefined8 **)in_RDI[2])();
  (*(code *)**(undefined8 **)in_RDI[3])();
  (*(code *)**(undefined8 **)in_RDI[4])();
  (*(code *)**(undefined8 **)in_RDI[5])();
  (*(code *)**(undefined8 **)in_RDI[6])();
  (*(code *)**(undefined8 **)in_RDI[7])();
  (*(code *)**(undefined8 **)in_RDI[8])();
  (*(code *)**(undefined8 **)in_RDI[9])();
  (*(code *)**(undefined8 **)in_RDI[10])();
  spx_free<soplex::Timer*>((Timer **)0x469681);
  spx_free<soplex::Timer*>((Timer **)0x46968f);
  spx_free<soplex::Timer*>((Timer **)0x46969d);
  spx_free<soplex::Timer*>((Timer **)0x4696ab);
  spx_free<soplex::Timer*>((Timer **)0x4696b9);
  spx_free<soplex::Timer*>((Timer **)0x4696c7);
  spx_free<soplex::Timer*>((Timer **)0x4696d5);
  spx_free<soplex::Timer*>((Timer **)0x4696e3);
  spx_free<soplex::Timer*>((Timer **)0x4696f1);
  spx_free<soplex::Timer*>((Timer **)0x4696ff);
  spx_free<soplex::Timer*>((Timer **)0x46970d);
  return;
}

Assistant:

~Statistics()
   {
      // we need to free all timers again (allocation happens in constructor)
      readingTime->~Timer();
      solvingTime->~Timer();
      preprocessingTime->~Timer();
      simplexTime->~Timer();
      syncTime->~Timer();
      transformTime->~Timer();
      rationalTime->~Timer();
      initialPrecisionTime->~Timer();
      extendedPrecisionTime->~Timer();
      reconstructionTime->~Timer();
      boostingStepTime->~Timer();
      spx_free(readingTime);
      spx_free(solvingTime);
      spx_free(preprocessingTime);
      spx_free(simplexTime);
      spx_free(syncTime);
      spx_free(transformTime);
      spx_free(rationalTime);
      spx_free(initialPrecisionTime);
      spx_free(extendedPrecisionTime);
      spx_free(reconstructionTime);
      spx_free(boostingStepTime);
   }